

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int get_entry_data_list(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_list_s *entry_data_list,
                       MMDB_data_pool_s *pool,int depth)

{
  uint32_t uVar1;
  uint32_t offset_00;
  int iVar2;
  int iVar3;
  MMDB_entry_data_list_s *pMVar4;
  MMDB_entry_data_list_s *list_value;
  int status_4;
  MMDB_entry_data_list_s *list_key;
  uint32_t size;
  int status_3;
  MMDB_entry_data_list_s *entry_data_list_to;
  uint32_t array_offset;
  uint32_t array_size;
  int status_2;
  int status_1;
  uint32_t last_offset;
  uint32_t next_offset;
  int status;
  int depth_local;
  MMDB_data_pool_s *pool_local;
  MMDB_entry_data_list_s *entry_data_list_local;
  uint32_t offset_local;
  MMDB_s *mmdb_local;
  
  if (depth < 0x200) {
    iVar2 = depth + 1;
    mmdb_local._4_4_ = decode_one(mmdb,offset,&entry_data_list->entry_data);
    if (mmdb_local._4_4_ == 0) {
      uVar1 = (entry_data_list->entry_data).type;
      if (uVar1 == 1) {
        uVar1 = (entry_data_list->entry_data).offset_to_next;
        offset_00 = (entry_data_list->entry_data).field_1.pointer;
        iVar3 = decode_one(mmdb,offset_00,&entry_data_list->entry_data);
        if (iVar3 != 0) {
          return iVar3;
        }
        if ((entry_data_list->entry_data).type == 1) {
          return 7;
        }
        if ((((entry_data_list->entry_data).type == 0xb) ||
            ((entry_data_list->entry_data).type == 7)) &&
           (iVar2 = get_entry_data_list(mmdb,offset_00,entry_data_list,pool,iVar2), iVar2 != 0)) {
          return iVar2;
        }
        (entry_data_list->entry_data).offset_to_next = uVar1;
      }
      else if (uVar1 == 7) {
        entry_data_list_local._4_4_ = (entry_data_list->entry_data).offset_to_next;
        list_key._0_4_ = (entry_data_list->entry_data).data_size;
        while ((uint32_t)list_key != 0) {
          pMVar4 = data_pool_alloc(pool);
          if (pMVar4 == (MMDB_entry_data_list_s *)0x0) {
            return 5;
          }
          iVar3 = get_entry_data_list(mmdb,entry_data_list_local._4_4_,pMVar4,pool,iVar2);
          if (iVar3 != 0) {
            return iVar3;
          }
          uVar1 = (pMVar4->entry_data).offset_to_next;
          pMVar4 = data_pool_alloc(pool);
          if (pMVar4 == (MMDB_entry_data_list_s *)0x0) {
            return 5;
          }
          iVar3 = get_entry_data_list(mmdb,uVar1,pMVar4,pool,iVar2);
          if (iVar3 != 0) {
            return iVar3;
          }
          entry_data_list_local._4_4_ = (pMVar4->entry_data).offset_to_next;
          list_key._0_4_ = (uint32_t)list_key - 1;
        }
        (entry_data_list->entry_data).offset_to_next = entry_data_list_local._4_4_;
      }
      else if (uVar1 == 0xb) {
        entry_data_list_to._0_4_ = (entry_data_list->entry_data).offset_to_next;
        entry_data_list_to._4_4_ = (entry_data_list->entry_data).data_size;
        while (entry_data_list_to._4_4_ != 0) {
          pMVar4 = data_pool_alloc(pool);
          if (pMVar4 == (MMDB_entry_data_list_s *)0x0) {
            return 5;
          }
          iVar3 = get_entry_data_list(mmdb,(uint32_t)entry_data_list_to,pMVar4,pool,iVar2);
          if (iVar3 != 0) {
            return iVar3;
          }
          entry_data_list_to._0_4_ = (pMVar4->entry_data).offset_to_next;
          entry_data_list_to._4_4_ = entry_data_list_to._4_4_ - 1;
        }
        (entry_data_list->entry_data).offset_to_next = (uint32_t)entry_data_list_to;
      }
      mmdb_local._4_4_ = 0;
    }
  }
  else {
    mmdb_local._4_4_ = 7;
  }
  return mmdb_local._4_4_;
}

Assistant:

static int get_entry_data_list(const MMDB_s *const mmdb,
                               uint32_t offset,
                               MMDB_entry_data_list_s *const entry_data_list,
                               MMDB_data_pool_s *const pool,
                               int depth) {
    if (depth >= MAXIMUM_DATA_STRUCTURE_DEPTH) {
        DEBUG_MSG("reached the maximum data structure depth");
        return MMDB_INVALID_DATA_ERROR;
    }
    depth++;
    CHECKED_DECODE_ONE(mmdb, offset, &entry_data_list->entry_data);

    switch (entry_data_list->entry_data.type) {
        case MMDB_DATA_TYPE_POINTER: {
            uint32_t next_offset = entry_data_list->entry_data.offset_to_next;
            uint32_t last_offset;
            CHECKED_DECODE_ONE(mmdb,
                               last_offset =
                                   entry_data_list->entry_data.pointer,
                               &entry_data_list->entry_data);

            /* Pointers to pointers are illegal under the spec */
            if (entry_data_list->entry_data.type == MMDB_DATA_TYPE_POINTER) {
                DEBUG_MSG("pointer points to another pointer");
                return MMDB_INVALID_DATA_ERROR;
            }

            if (entry_data_list->entry_data.type == MMDB_DATA_TYPE_ARRAY ||
                entry_data_list->entry_data.type == MMDB_DATA_TYPE_MAP) {

                int status = get_entry_data_list(
                    mmdb, last_offset, entry_data_list, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on pointer failed.");
                    return status;
                }
            }
            entry_data_list->entry_data.offset_to_next = next_offset;
        } break;
        case MMDB_DATA_TYPE_ARRAY: {
            uint32_t array_size = entry_data_list->entry_data.data_size;
            uint32_t array_offset = entry_data_list->entry_data.offset_to_next;
            while (array_size-- > 0) {
                MMDB_entry_data_list_s *entry_data_list_to =
                    data_pool_alloc(pool);
                if (!entry_data_list_to) {
                    return MMDB_OUT_OF_MEMORY_ERROR;
                }

                int status = get_entry_data_list(
                    mmdb, array_offset, entry_data_list_to, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on array element failed.");
                    return status;
                }

                array_offset = entry_data_list_to->entry_data.offset_to_next;
            }
            entry_data_list->entry_data.offset_to_next = array_offset;

        } break;
        case MMDB_DATA_TYPE_MAP: {
            uint32_t size = entry_data_list->entry_data.data_size;

            offset = entry_data_list->entry_data.offset_to_next;
            while (size-- > 0) {
                MMDB_entry_data_list_s *list_key = data_pool_alloc(pool);
                if (!list_key) {
                    return MMDB_OUT_OF_MEMORY_ERROR;
                }

                int status =
                    get_entry_data_list(mmdb, offset, list_key, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on map key failed.");
                    return status;
                }

                offset = list_key->entry_data.offset_to_next;

                MMDB_entry_data_list_s *list_value = data_pool_alloc(pool);
                if (!list_value) {
                    return MMDB_OUT_OF_MEMORY_ERROR;
                }

                status =
                    get_entry_data_list(mmdb, offset, list_value, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on map element failed.");
                    return status;
                }
                offset = list_value->entry_data.offset_to_next;
            }
            entry_data_list->entry_data.offset_to_next = offset;
        } break;
        default:
            break;
    }

    return MMDB_SUCCESS;
}